

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

size_t __thiscall efsw::String::find_first_of(String *this,char *s,size_t pos,size_t n)

{
  size_t sVar1;
  String local_48;
  size_t local_28;
  size_t n_local;
  size_t pos_local;
  char *s_local;
  String *this_local;
  
  local_28 = n;
  n_local = pos;
  pos_local = (size_t)s;
  s_local = (char *)this;
  String(&local_48,s);
  sVar1 = find_first_of(this,&local_48,n_local);
  ~String(&local_48);
  return sVar1;
}

Assistant:

std::size_t String::find_first_of( const char* s, std::size_t pos, std::size_t n ) const {
	return find_first_of( String( s ), pos );
}